

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# System.cc
# Opt level: O0

void Minisat::setX86FPUPrecision(void)

{
  fpu_control_t newcw;
  fpu_control_t oldcw;
  
  printf("WARNING: for repeatability, setting FPU to use double precision\n");
  return;
}

Assistant:

void Minisat::setX86FPUPrecision()
{
#if defined(__linux__) && defined(_FPU_EXTENDED) && defined(_FPU_DOUBLE) && defined(_FPU_GETCW)
    // Only correct FPU precision on Linux architectures that needs and supports it:
    fpu_control_t oldcw, newcw;
    _FPU_GETCW(oldcw); newcw = (oldcw & ~_FPU_EXTENDED) | _FPU_DOUBLE; _FPU_SETCW(newcw);
    printf("WARNING: for repeatability, setting FPU to use double precision\n");
#endif
}